

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_extensions.cpp
# Opt level: O0

bool __thiscall
ONX_Model::Write(ONX_Model *this,ON_BinaryArchive *archive,int version,ON_TextLog *error_log)

{
  ONX_Model_UserData *uuid;
  bool bVar1;
  int iVar2;
  uint uVar3;
  char *sStartSectionComment;
  ONX_ModelComponentList *pOVar4;
  ONX_Model_UserData **ppOVar5;
  ON_UUID plugin_id;
  bool local_21a;
  bool local_20d;
  bool local_20c;
  bool local_20b;
  bool local_20a;
  bool local_209;
  ONX_Model_UserData *model_ud;
  int i;
  ON_UUID model_user_string_plugin_id;
  ONX_ModelComponentReferenceLink *link_11;
  ONX_ModelComponentReferenceLink *link_10;
  ONX_ModelComponentReferenceLink *link_9;
  ONX_ModelComponentReferenceLink *link_8;
  ONX_ModelComponentReferenceLink *link_7;
  ONX_ModelComponentReferenceLink *link_6;
  ONX_ModelComponentReferenceLink *link_5;
  undefined1 local_150 [8];
  ON_Layer layer;
  ONX_ModelComponentReferenceLink *link_4;
  ONX_ModelComponentReferenceLink *pOStack_58;
  uint layer_count;
  ONX_ModelComponentReferenceLink *link_3;
  ONX_ModelComponentReferenceLink *link_2;
  ONX_ModelComponentReferenceLink *link_1;
  ONX_ModelComponentReferenceLink *link;
  bool ok;
  ON_TextLog *error_log_local;
  int version_local;
  ON_BinaryArchive *archive_local;
  ONX_Model *this_local;
  
  ONX_ModelPrivate::UpdateRDKUserData(this->m_private,version);
  error_log_local._4_4_ = version;
  if (((version != 0) &&
      ((((version < 2 || (iVar2 = ON_BinaryArchive::CurrentArchiveVersion(), iVar2 < version)) ||
        ((version < 0x32 &&
         (iVar2 = ON_BinaryArchive::CurrentArchiveVersion(), iVar2 / 10 < version)))) ||
       ((0x31 < version && (version % 10 != 0)))))) &&
     (error_log_local._4_4_ = 0, error_log != (ON_TextLog *)0x0)) {
    iVar2 = ON_BinaryArchive::CurrentArchiveVersion();
    uVar3 = ON_BinaryArchive::CurrentArchiveVersion();
    ON_TextLog::Print(error_log,
                      "ONX_Model::Write version parameter = %d; it must be 0, or >= 2 and <= %d, or a multiple of 10 >= 50 and <= %d.\n"
                      ,0,(ulong)(uint)(iVar2 / 10),(ulong)uVar3);
  }
  bVar1 = ON_BinaryArchive::WriteMode(archive);
  if (bVar1) {
    sStartSectionComment = ON_String::operator_cast_to_char_(&this->m_sStartSectionComments);
    bVar1 = ON_BinaryArchive::Write3dmStartSection
                      (archive,error_log_local._4_4_,sStartSectionComment);
    if (bVar1) {
      if ((this->m_properties).m_RevisionHistory.m_revision_count == 0) {
        ON_3dmRevisionHistory::NewRevision(&(this->m_properties).m_RevisionHistory);
      }
      bVar1 = ON_BinaryArchive::Write3dmProperties(archive,&this->m_properties);
      if (bVar1) {
        bVar1 = ON_BinaryArchive::Write3dmSettings(archive,&this->m_settings);
        if (bVar1) {
          link._7_1_ = ON_BinaryArchive::BeginWrite3dmBitmapTable(archive);
          if (link._7_1_) {
            pOVar4 = Internal_ComponentListConst(this,Image);
            link_1 = pOVar4->m_first_mcr_link;
            while( true ) {
              local_209 = false;
              if (link_1 != (ONX_ModelComponentReferenceLink *)0x0) {
                local_209 = link._7_1_;
              }
              if (local_209 == false) break;
              link._7_1_ = ON_BinaryArchive::Write3dmImageComponent(archive,&link_1->m_mcr);
              if ((!link._7_1_) && (error_log != (ON_TextLog *)0x0)) {
                ON_TextLog::Print(error_log,
                                  "ONX_Model::Write archive.Write3dmImageComponent() failed.\n");
              }
              link_1 = link_1->m_next;
            }
            bVar1 = ON_BinaryArchive::EndWrite3dmBitmapTable(archive);
            if (bVar1) {
              if (link._7_1_ == false) {
                this_local._7_1_ = false;
              }
              else {
                iVar2 = ON_BinaryArchive::Archive3dmVersion(archive);
                if (3 < iVar2) {
                  link._7_1_ = ON_BinaryArchive::BeginWrite3dmTextureMappingTable(archive);
                  if (!link._7_1_) {
                    if (error_log != (ON_TextLog *)0x0) {
                      ON_TextLog::Print(error_log,
                                        "ONX_Model::Write archive.BeginWrite3dmTextureMappingTable() failed.\n"
                                       );
                    }
                    return false;
                  }
                  pOVar4 = Internal_ComponentListConst(this,TextureMapping);
                  link_2 = pOVar4->m_first_mcr_link;
                  while( true ) {
                    local_20a = false;
                    if (link_2 != (ONX_ModelComponentReferenceLink *)0x0) {
                      local_20a = link._7_1_;
                    }
                    if (local_20a == false) break;
                    link._7_1_ = ON_BinaryArchive::Write3dmTextureMappingComponent
                                           (archive,&link_2->m_mcr);
                    if ((!link._7_1_) && (error_log != (ON_TextLog *)0x0)) {
                      ON_TextLog::Print(error_log,
                                        "ONX_Model::Write archive.TextureMapping() failed.\n");
                    }
                    link_2 = link_2->m_next;
                  }
                  bVar1 = ON_BinaryArchive::EndWrite3dmTextureMappingTable(archive);
                  if (!bVar1) {
                    if (error_log != (ON_TextLog *)0x0) {
                      ON_TextLog::Print(error_log,
                                        "ONX_Model::Write archive.EndWrite3dmTextureMappingTable() failed.\n"
                                       );
                    }
                    return false;
                  }
                  if (link._7_1_ == false) {
                    return false;
                  }
                }
                link._7_1_ = ON_BinaryArchive::BeginWrite3dmMaterialTable(archive);
                if (link._7_1_) {
                  pOVar4 = Internal_ComponentListConst(this,Material);
                  link_3 = pOVar4->m_first_mcr_link;
                  while( true ) {
                    local_20b = false;
                    if (link_3 != (ONX_ModelComponentReferenceLink *)0x0) {
                      local_20b = link._7_1_;
                    }
                    if (local_20b == false) break;
                    link._7_1_ = ON_BinaryArchive::Write3dmMaterialComponent(archive,&link_3->m_mcr)
                    ;
                    if ((!link._7_1_) && (error_log != (ON_TextLog *)0x0)) {
                      ON_TextLog::Print(error_log,
                                        "ONX_Model::Write archive.Write3dmMaterialComponent() failed.\n"
                                       );
                    }
                    link_3 = link_3->m_next;
                  }
                  bVar1 = ON_BinaryArchive::EndWrite3dmMaterialTable(archive);
                  if (bVar1) {
                    if (link._7_1_ == false) {
                      this_local._7_1_ = false;
                    }
                    else {
                      iVar2 = ON_BinaryArchive::Archive3dmVersion(archive);
                      if (3 < iVar2) {
                        link._7_1_ = ON_BinaryArchive::BeginWrite3dmLinetypeTable(archive);
                        if (!link._7_1_) {
                          if (error_log != (ON_TextLog *)0x0) {
                            ON_TextLog::Print(error_log,
                                              "ONX_Model::Write archive.BeginWrite3dmLinetypeTable() failed.\n"
                                             );
                          }
                          return false;
                        }
                        pOVar4 = Internal_ComponentListConst(this,LinePattern);
                        pOStack_58 = pOVar4->m_first_mcr_link;
                        while( true ) {
                          local_20c = false;
                          if (pOStack_58 != (ONX_ModelComponentReferenceLink *)0x0) {
                            local_20c = link._7_1_;
                          }
                          if (local_20c == false) break;
                          link._7_1_ = ON_BinaryArchive::Write3dmLinePatternComponent
                                                 (archive,&pOStack_58->m_mcr);
                          if ((!link._7_1_) && (error_log != (ON_TextLog *)0x0)) {
                            ON_TextLog::Print(error_log,
                                              "ONX_Model::Write archive.Write3dmLinePatternComponent() failed.\n"
                                             );
                          }
                          pOStack_58 = pOStack_58->m_next;
                        }
                        bVar1 = ON_BinaryArchive::EndWrite3dmLinetypeTable(archive);
                        if (!bVar1) {
                          if (error_log != (ON_TextLog *)0x0) {
                            ON_TextLog::Print(error_log,
                                              "ONX_Model::Write archive.EndWrite3dmLinetypeTable() failed.\n"
                                             );
                          }
                          return false;
                        }
                        if (link._7_1_ == false) {
                          return false;
                        }
                      }
                      link._7_1_ = ON_BinaryArchive::BeginWrite3dmLayerTable(archive);
                      if (link._7_1_) {
                        link_4._4_4_ = 0;
                        pOVar4 = Internal_ComponentListConst(this,Layer);
                        layer.m_private = (ON_LayerPrivate *)pOVar4->m_first_mcr_link;
                        while( true ) {
                          local_20d = false;
                          if (layer.m_private != (ON_LayerPrivate *)0x0) {
                            local_20d = link._7_1_;
                          }
                          if (local_20d == false) break;
                          link._7_1_ = ON_BinaryArchive::Write3dmLayerComponent
                                                 (archive,(ON_ModelComponentReference *)
                                                          layer.m_private);
                          if (link._7_1_) {
                            link_4._4_4_ = link_4._4_4_ + 1;
                          }
                          else if (error_log != (ON_TextLog *)0x0) {
                            ON_TextLog::Print(error_log,
                                              "ONX_Model::Write archive.Write3dmLayerComponent() failed.\n"
                                             );
                          }
                          layer.m_private =
                               (ON_LayerPrivate *)
                               layer.m_private[1].m_custom_section_style.
                               super___shared_ptr<ON_SectionStyle,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr;
                        }
                        if ((link_4._4_4_ == 0) && (link._7_1_ != false)) {
                          ON_Layer::ON_Layer((ON_Layer *)local_150,&ON_Layer::Default);
                          ON_ModelComponent::SetId((ON_ModelComponent *)local_150);
                          ON_ModelComponent::SetIndex((ON_ModelComponent *)local_150,0);
                          link._7_1_ = ON_BinaryArchive::Write3dmLayer
                                                 (archive,(ON_Layer *)local_150);
                          if ((!link._7_1_) && (error_log != (ON_TextLog *)0x0)) {
                            ON_TextLog::Print(error_log,
                                              "ONX_Model::Write archive.Write3dmLayer() failed.\n");
                          }
                          ON_Layer::~ON_Layer((ON_Layer *)local_150);
                        }
                        bVar1 = ON_BinaryArchive::EndWrite3dmLayerTable(archive);
                        if (bVar1) {
                          if (link._7_1_ == false) {
                            this_local._7_1_ = false;
                          }
                          else {
                            link._7_1_ = ON_BinaryArchive::BeginWrite3dmGroupTable(archive);
                            if (link._7_1_) {
                              pOVar4 = Internal_ComponentListConst(this,Group);
                              link_6 = pOVar4->m_first_mcr_link;
                              while( true ) {
                                local_21a = false;
                                if (link_6 != (ONX_ModelComponentReferenceLink *)0x0) {
                                  local_21a = link._7_1_;
                                }
                                if (local_21a == false) break;
                                link._7_1_ = ON_BinaryArchive::Write3dmGroupComponent
                                                       (archive,&link_6->m_mcr);
                                if ((!link._7_1_) && (error_log != (ON_TextLog *)0x0)) {
                                  ON_TextLog::Print(error_log,
                                                                                                        
                                                  "ONX_Model::Write archive.Write3dmGroupComponent() failed.\n"
                                                  );
                                }
                                link_6 = link_6->m_next;
                              }
                              bVar1 = ON_BinaryArchive::EndWrite3dmGroupTable(archive);
                              if (bVar1) {
                                if (link._7_1_ == false) {
                                  this_local._7_1_ = false;
                                }
                                else {
                                  iVar2 = ON_BinaryArchive::Archive3dmVersion(archive);
                                  if (2 < iVar2) {
                                    link._7_1_ = ON_BinaryArchive::BeginWrite3dmDimStyleTable
                                                           (archive);
                                    if (!link._7_1_) {
                                      if (error_log != (ON_TextLog *)0x0) {
                                        ON_TextLog::Print(error_log,
                                                                                                                    
                                                  "ONX_Model::Write archive.BeginWrite3dmDimStyleTable() failed.\n"
                                                  );
                                      }
                                      return false;
                                    }
                                    pOVar4 = Internal_ComponentListConst(this,DimStyle);
                                    for (link_7 = pOVar4->m_first_mcr_link;
                                        link_7 != (ONX_ModelComponentReferenceLink *)0x0;
                                        link_7 = link_7->m_next) {
                                      link._7_1_ = ON_BinaryArchive::Write3dmDimStyleComponent
                                                             (archive,&link_7->m_mcr);
                                      if ((!link._7_1_) && (error_log != (ON_TextLog *)0x0)) {
                                        ON_TextLog::Print(error_log,
                                                                                                                    
                                                  "ONX_Model::Write archive.Write3dmDimStyleComponent() failed.\n"
                                                  );
                                      }
                                    }
                                    bVar1 = ON_BinaryArchive::EndWrite3dmDimStyleTable(archive);
                                    if (!bVar1) {
                                      if (error_log != (ON_TextLog *)0x0) {
                                        ON_TextLog::Print(error_log,
                                                                                                                    
                                                  "ONX_Model::Write archive.EndWrite3dmDimStyleTable() failed.\n"
                                                  );
                                      }
                                      return false;
                                    }
                                    if (link._7_1_ == false) {
                                      return false;
                                    }
                                  }
                                  link._7_1_ = ON_BinaryArchive::BeginWrite3dmLightTable(archive);
                                  if (link._7_1_) {
                                    pOVar4 = Internal_ComponentListConst(this,RenderLight);
                                    for (link_8 = pOVar4->m_first_mcr_link;
                                        link_8 != (ONX_ModelComponentReferenceLink *)0x0;
                                        link_8 = link_8->m_next) {
                                      link._7_1_ = ON_BinaryArchive::Write3dmModelLightComponent
                                                             (archive,&link_8->m_mcr);
                                      if ((!link._7_1_) && (error_log != (ON_TextLog *)0x0)) {
                                        ON_TextLog::Print(error_log,
                                                                                                                    
                                                  "ONX_Model::Write archive.Write3dmModelLightComponent() failed.\n"
                                                  );
                                      }
                                    }
                                    bVar1 = ON_BinaryArchive::EndWrite3dmLightTable(archive);
                                    if (bVar1) {
                                      if (link._7_1_ == false) {
                                        this_local._7_1_ = false;
                                      }
                                      else {
                                        iVar2 = ON_BinaryArchive::Archive3dmVersion(archive);
                                        if (3 < iVar2) {
                                          link._7_1_ = ON_BinaryArchive::
                                                       BeginWrite3dmHatchPatternTable(archive);
                                          if (!link._7_1_) {
                                            if (error_log != (ON_TextLog *)0x0) {
                                              ON_TextLog::Print(error_log,
                                                                                                                                
                                                  "ONX_Model::Write archive.BeginWrite3dmHatchPatternTable() failed.\n"
                                                  );
                                            }
                                            return false;
                                          }
                                          pOVar4 = Internal_ComponentListConst(this,HatchPattern);
                                          for (link_9 = pOVar4->m_first_mcr_link;
                                              link_9 != (ONX_ModelComponentReferenceLink *)0x0;
                                              link_9 = link_9->m_next) {
                                            link._7_1_ = ON_BinaryArchive::
                                                         Write3dmHatchPatternComponent
                                                                   (archive,&link_9->m_mcr);
                                            if ((!link._7_1_) && (error_log != (ON_TextLog *)0x0)) {
                                              ON_TextLog::Print(error_log,
                                                                                                                                
                                                  "ONX_Model::Write archive.Write3dmHatchPatternComponent() failed.\n"
                                                  );
                                            }
                                          }
                                          bVar1 = ON_BinaryArchive::EndWrite3dmHatchPatternTable
                                                            (archive);
                                          if (!bVar1) {
                                            if (error_log != (ON_TextLog *)0x0) {
                                              ON_TextLog::Print(error_log,
                                                                                                                                
                                                  "ONX_Model::Write archive.EndWrite3dmHatchPatternTable() failed.\n"
                                                  );
                                            }
                                            return false;
                                          }
                                          if (link._7_1_ == false) {
                                            return false;
                                          }
                                        }
                                        iVar2 = ON_BinaryArchive::Archive3dmVersion(archive);
                                        if (2 < iVar2) {
                                          link._7_1_ = ON_BinaryArchive::
                                                       BeginWrite3dmInstanceDefinitionTable(archive)
                                          ;
                                          if (!link._7_1_) {
                                            if (error_log != (ON_TextLog *)0x0) {
                                              ON_TextLog::Print(error_log,
                                                                                                                                
                                                  "ONX_Model::Write archive.BeginWrite3dmInstanceDefinitionTable() failed.\n"
                                                  );
                                            }
                                            return false;
                                          }
                                          pOVar4 = Internal_ComponentListConst
                                                             (this,InstanceDefinition);
                                          for (link_10 = pOVar4->m_first_mcr_link;
                                              link_10 != (ONX_ModelComponentReferenceLink *)0x0;
                                              link_10 = link_10->m_next) {
                                            link._7_1_ = ON_BinaryArchive::
                                                         Write3dmInstanceDefinitionComponent
                                                                   (archive,&link_10->m_mcr);
                                            if ((!link._7_1_) && (error_log != (ON_TextLog *)0x0)) {
                                              ON_TextLog::Print(error_log,
                                                                                                                                
                                                  "ONX_Model::Write archive.Write3dmInstanceDefinitionComponent() failed.\n"
                                                  );
                                            }
                                          }
                                          bVar1 = ON_BinaryArchive::
                                                  EndWrite3dmInstanceDefinitionTable(archive);
                                          if (!bVar1) {
                                            if (error_log != (ON_TextLog *)0x0) {
                                              ON_TextLog::Print(error_log,
                                                                                                                                
                                                  "ONX_Model::Write archive.EndWrite3dmInstanceDefinitionTable() failed.\n"
                                                  );
                                            }
                                            return false;
                                          }
                                          if (link._7_1_ == false) {
                                            return false;
                                          }
                                        }
                                        link._7_1_ = ON_BinaryArchive::BeginWrite3dmObjectTable
                                                               (archive);
                                        if (link._7_1_) {
                                          pOVar4 = Internal_ComponentListConst(this,ModelGeometry);
                                          for (link_11 = pOVar4->m_first_mcr_link;
                                              link_11 != (ONX_ModelComponentReferenceLink *)0x0;
                                              link_11 = link_11->m_next) {
                                            link._7_1_ = ON_BinaryArchive::
                                                         Write3dmModelGeometryComponent
                                                                   (archive,&link_11->m_mcr);
                                            if ((!link._7_1_) && (error_log != (ON_TextLog *)0x0)) {
                                              ON_TextLog::Print(error_log,
                                                                                                                                
                                                  "ONX_Model::Write archive.Write3dmModelGeometryComponent() failed.\n"
                                                  );
                                            }
                                          }
                                          bVar1 = ON_BinaryArchive::EndWrite3dmObjectTable(archive);
                                          if (bVar1) {
                                            if (link._7_1_ == false) {
                                              this_local._7_1_ = false;
                                            }
                                            else {
                                              iVar2 = ON_BinaryArchive::Archive3dmVersion(archive);
                                              if (3 < iVar2) {
                                                link._7_1_ = ON_BinaryArchive::
                                                             BeginWrite3dmHistoryRecordTable
                                                                       (archive);
                                                if (!link._7_1_) {
                                                  if (error_log != (ON_TextLog *)0x0) {
                                                    ON_TextLog::Print(error_log,
                                                                                                                                            
                                                  "ONX_Model::Write archive.BeginWrite3dmHistoryRecordTable() failed.\n"
                                                  );
                                                  }
                                                  return false;
                                                }
                                                pOVar4 = Internal_ComponentListConst
                                                                   (this,HistoryRecord);
                                                for (model_user_string_plugin_id.Data4 =
                                                          (uchar  [8])pOVar4->m_first_mcr_link;
                                                    model_user_string_plugin_id.Data4 !=
                                                    (uchar  [8])0x0;
                                                    model_user_string_plugin_id.Data4 =
                                                         *(uchar (*) [8])
                                                          ((long)model_user_string_plugin_id.Data4 +
                                                          0x18)) {
                                                  link._7_1_ = ON_BinaryArchive::
                                                               Write3dmHistoryRecordComponent
                                                                         (archive,(
                                                  ON_ModelComponentReference *)
                                                  model_user_string_plugin_id.Data4);
                                                  if ((!link._7_1_) &&
                                                     (error_log != (ON_TextLog *)0x0)) {
                                                    ON_TextLog::Print(error_log,
                                                                                                                                            
                                                  "ONX_Model::Write archive.Write3dmistoryRecordComponent() failed.\n"
                                                  );
                                                  }
                                                }
                                                bVar1 = ON_BinaryArchive::
                                                        EndWrite3dmHistoryRecordTable(archive);
                                                if (!bVar1) {
                                                  if (error_log != (ON_TextLog *)0x0) {
                                                    ON_TextLog::Print(error_log,
                                                                                                                                            
                                                  "ONX_Model::Write archive.EndWrite3dmHistoryTable() failed.\n"
                                                  );
                                                  }
                                                  return false;
                                                }
                                                if (link._7_1_ == false) {
                                                  return false;
                                                }
                                              }
                                              bVar1 = ON_BinaryArchive::ArchiveContains3dmTable
                                                                (archive,user_table);
                                              if (bVar1) {
                                                if ((this->m_model_user_string_list !=
                                                     (ON_DocumentUserStringList *)0x0) &&
                                                   (iVar2 = ON_Object::UserStringCount
                                                                      (&this->
                                                  m_model_user_string_list->super_ON_Object),
                                                  0 < iVar2)) {
                                                  plugin_id = ON_ClassId::Uuid(&
                                                  ON_DocumentUserStringList::
                                                  m_ON_DocumentUserStringList_class_rtti);
                                                  bVar1 = ON_BinaryArchive::BeginWrite3dmUserTable
                                                                    (archive,plugin_id,false,0,0);
                                                  if (bVar1) {
                                                    ON_BinaryArchive::WriteObject
                                                              (archive,&this->
                                                  m_model_user_string_list->super_ON_Object);
                                                  ON_BinaryArchive::EndWrite3dmUserTable(archive);
                                                  }
                                                }
                                                model_ud._4_4_ = 0;
                                                while( true ) {
                                                  bVar1 = false;
                                                  if (link._7_1_ != false) {
                                                    iVar2 = ON_SimpleArray<ONX_Model_UserData_*>::
                                                            Count(&this->m_userdata_table);
                                                    bVar1 = model_ud._4_4_ < iVar2;
                                                  }
                                                  if (!bVar1) break;
                                                  ppOVar5 = ON_SimpleArray<ONX_Model_UserData_*>::
                                                            operator[](&this->m_userdata_table,
                                                                       model_ud._4_4_);
                                                  uuid = *ppOVar5;
                                                  if ((uuid != (ONX_Model_UserData *)0x0) &&
                                                     (bVar1 = ON_UuidIsNotNil(&uuid->m_uuid), bVar1)
                                                     ) {
                                                    ON_BinaryArchive::
                                                    Write3dmAnonymousUserTableRecord
                                                              (archive,uuid->m_uuid,
                                                               uuid->m_usertable_3dm_version,
                                                               uuid->m_usertable_opennurbs_version,
                                                               &uuid->m_goo);
                                                  }
                                                  model_ud._4_4_ = model_ud._4_4_ + 1;
                                                }
                                              }
                                              bVar1 = ON_BinaryArchive::Write3dmEndMark(archive);
                                              if ((!bVar1) &&
                                                 (link._7_1_ = false, error_log != (ON_TextLog *)0x0
                                                 )) {
                                                ON_TextLog::Print(error_log,
                                                                                                                                    
                                                  "ONX_Model::Write archive.Write3dmEndMark() failed.\n"
                                                  );
                                              }
                                              this_local._7_1_ = link._7_1_;
                                            }
                                          }
                                          else {
                                            if (error_log != (ON_TextLog *)0x0) {
                                              ON_TextLog::Print(error_log,
                                                                                                                                
                                                  "ONX_Model::Write archive.EndWrite3dmObjectTable() failed.\n"
                                                  );
                                            }
                                            this_local._7_1_ = false;
                                          }
                                        }
                                        else {
                                          if (error_log != (ON_TextLog *)0x0) {
                                            ON_TextLog::Print(error_log,
                                                                                                                            
                                                  "ONX_Model::Write archive.BeginWrite3dmObjectTable() failed.\n"
                                                  );
                                          }
                                          this_local._7_1_ = false;
                                        }
                                      }
                                    }
                                    else {
                                      if (error_log != (ON_TextLog *)0x0) {
                                        ON_TextLog::Print(error_log,
                                                                                                                    
                                                  "ONX_Model::Write archive.EndWrite3dmLightTable() failed.\n"
                                                  );
                                      }
                                      this_local._7_1_ = false;
                                    }
                                  }
                                  else {
                                    if (error_log != (ON_TextLog *)0x0) {
                                      ON_TextLog::Print(error_log,
                                                                                                                
                                                  "ONX_Model::Write archive.BeginWrite3dmLightTable() failed.\n"
                                                  );
                                    }
                                    this_local._7_1_ = false;
                                  }
                                }
                              }
                              else {
                                if (error_log != (ON_TextLog *)0x0) {
                                  ON_TextLog::Print(error_log,
                                                                                                        
                                                  "ONX_Model::Write archive.EndWrite3dmGroupTable() failed.\n"
                                                  );
                                }
                                this_local._7_1_ = false;
                              }
                            }
                            else {
                              if (error_log != (ON_TextLog *)0x0) {
                                ON_TextLog::Print(error_log,
                                                  "ONX_Model::Write archive.BeginWrite3dmGroupTable() failed.\n"
                                                 );
                              }
                              this_local._7_1_ = false;
                            }
                          }
                        }
                        else {
                          if (error_log != (ON_TextLog *)0x0) {
                            ON_TextLog::Print(error_log,
                                              "ONX_Model::Write archive.EndWrite3dmLayerTable() failed.\n"
                                             );
                          }
                          this_local._7_1_ = false;
                        }
                      }
                      else {
                        if (error_log != (ON_TextLog *)0x0) {
                          ON_TextLog::Print(error_log,
                                            "ONX_Model::Write archive.BeginWrite3dmLayerTable() failed.\n"
                                           );
                        }
                        this_local._7_1_ = false;
                      }
                    }
                  }
                  else {
                    if (error_log != (ON_TextLog *)0x0) {
                      ON_TextLog::Print(error_log,
                                        "ONX_Model::Write archive.EndWrite3dmMaterialTable() failed.\n"
                                       );
                    }
                    this_local._7_1_ = false;
                  }
                }
                else {
                  if (error_log != (ON_TextLog *)0x0) {
                    ON_TextLog::Print(error_log,
                                      "ONX_Model::Write archive.BeginWrite3dmMaterialTable() failed.\n"
                                     );
                  }
                  this_local._7_1_ = false;
                }
              }
            }
            else {
              if (error_log != (ON_TextLog *)0x0) {
                ON_TextLog::Print(error_log,
                                  "ONX_Model::Write archive.EndWrite3dmBitmapTable() failed.\n");
              }
              this_local._7_1_ = false;
            }
          }
          else {
            if (error_log != (ON_TextLog *)0x0) {
              ON_TextLog::Print(error_log,
                                "ONX_Model::Write archive.BeginWrite3dmBitmapTable() failed.\n");
            }
            this_local._7_1_ = false;
          }
        }
        else {
          if (error_log != (ON_TextLog *)0x0) {
            ON_TextLog::Print(error_log,
                              "ONX_Model::Write archive.Write3dmSettings() failed.\nYour m_settings information is not valid or basic file writing failed.\n"
                             );
          }
          this_local._7_1_ = false;
        }
      }
      else {
        if (error_log != (ON_TextLog *)0x0) {
          ON_TextLog::Print(error_log,
                            "ONX_Model::Write archive.Write3dmProperties() failed.\nYour m_properties information is not valid or basic file writing failed.\n"
                           );
        }
        this_local._7_1_ = false;
      }
    }
    else {
      if (error_log != (ON_TextLog *)0x0) {
        ON_TextLog::Print(error_log,
                          "ONX_Model::Write archive.Write3dmStartSection() failed.\nYour archive is not properly initialized\n(make sure you passed ON::archive_mode::write3dm to the constructor),\na file is locked, a disk is locked, or something along those lines.\n"
                         );
      }
      this_local._7_1_ = false;
    }
  }
  else {
    if (error_log != (ON_TextLog *)0x0) {
      ON_TextLog::Print(error_log,
                        "ONX_Model::Write archive.Mode() is not ON::archive_mode::write3dm.\nSee ONX_Model::Write example in the header file.\n"
                       );
    }
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ONX_Model::Write(ON_BinaryArchive& archive, int version, ON_TextLog* error_log) const
{
  m_private->UpdateRDKUserData(version);

  if ( 0 != version )
  {
    if (  version < 2
      ||  version > ON_BinaryArchive::CurrentArchiveVersion()
      || (version < 50 && version > ON_BinaryArchive::CurrentArchiveVersion()/10)
      || (version >= 50 && 0 != (version % 10))
      )
    {
      version = 0;
      if ( error_log) error_log->Print("ONX_Model::Write version parameter = %d; it must be 0, or >= 2 and <= %d, or a multiple of 10 >= 50 and <= %d.\n",
                      version,ON_BinaryArchive::CurrentArchiveVersion()/10,ON_BinaryArchive::CurrentArchiveVersion());
    }
  }

  if ( !archive.WriteMode() )
  {
    // You passed in a bogus archive. You must pass ON::archive_mode::write3dm to the archive constructor.
    if ( error_log) error_log->Print("ONX_Model::Write archive.Mode() is not ON::archive_mode::write3dm.\n"
                    "See ONX_Model::Write example in the header file.\n");
    return false;
  }

  bool ok;

  // START SECTION
  ok = archive.Write3dmStartSection( version, static_cast< const char* >(m_sStartSectionComments) );
  if ( !ok )
  {
    // make sure your archive was created with ON::archive_mode::write3dm mode.
    if ( error_log) error_log->Print("ONX_Model::Write archive.Write3dmStartSection() failed.\n"
                    "Your archive is not properly initialized\n"
                    "(make sure you passed ON::archive_mode::write3dm to the constructor),\n"
                    "a file is locked, a disk is locked, or something along those lines.\n");
    return false;
  }

  // PROPERTIES SECTION
  if ( m_properties.m_RevisionHistory.m_revision_count == 0 )
    const_cast<ONX_Model*>(this)->m_properties.m_RevisionHistory.NewRevision();

  ok = archive.Write3dmProperties( m_properties );
  if ( !ok )
  {
    // make sure m_properties is valid
    if ( error_log) error_log->Print("ONX_Model::Write archive.Write3dmProperties() failed.\n"
                    "Your m_properties information is not valid or basic file writing failed.\n"
                    );
    return false;
  }

  // SETTINGS SECTION
  ok = archive.Write3dmSettings( m_settings );
  if ( !ok )
  {
    // make sure m_settings is valid
    if ( error_log) error_log->Print("ONX_Model::Write archive.Write3dmSettings() failed.\n"
                    "Your m_settings information is not valid or basic file writing failed.\n");
    return false;
  }

  // BITMAP TABLE
  ok = archive.BeginWrite3dmBitmapTable();
  if ( !ok )
  {
    if ( error_log) error_log->Print("ONX_Model::Write archive.BeginWrite3dmBitmapTable() failed.\n");
    return false;
  }
  
  for( 
    class ONX_ModelComponentReferenceLink* link = Internal_ComponentListConst(ON_ModelComponent::Type::Image).m_first_mcr_link;
    nullptr != link && ok;
    link = link->m_next
    )
  {
    ok = archive.Write3dmImageComponent(link->m_mcr);
    if ( !ok )
    {
      if ( error_log) error_log->Print("ONX_Model::Write archive.Write3dmImageComponent() failed.\n");
    }
  } 

  if ( !archive.EndWrite3dmBitmapTable() )
  {
    if ( error_log) error_log->Print("ONX_Model::Write archive.EndWrite3dmBitmapTable() failed.\n");
    return false;
  }
  if (!ok)
    return false;


  // TEXTURE MAPPING TABLE
  if ( archive.Archive3dmVersion() >= 4 )
  {
    ok = archive.BeginWrite3dmTextureMappingTable();
    if ( !ok )
    {
      if ( error_log) error_log->Print("ONX_Model::Write archive.BeginWrite3dmTextureMappingTable() failed.\n");
      return false;
    }

    for( 
      class ONX_ModelComponentReferenceLink* link = Internal_ComponentListConst(ON_ModelComponent::Type::TextureMapping).m_first_mcr_link;
      nullptr != link && ok;
      link = link->m_next
      )
    {
      ok = archive.Write3dmTextureMappingComponent(link->m_mcr);
      if ( !ok )
      {
        if ( error_log) error_log->Print("ONX_Model::Write archive.TextureMapping() failed.\n");
      }
    } 

    if ( !archive.EndWrite3dmTextureMappingTable() )
    {
      if ( error_log) error_log->Print("ONX_Model::Write archive.EndWrite3dmTextureMappingTable() failed.\n");
      return false;
    }
    if (!ok)
      return false;
  }

  // MATERIAL TABLE
  ok = archive.BeginWrite3dmMaterialTable();
  if ( !ok )
  {
    if ( error_log) error_log->Print("ONX_Model::Write archive.BeginWrite3dmMaterialTable() failed.\n");
    return false;
  }

  for( 
    class ONX_ModelComponentReferenceLink* link = Internal_ComponentListConst(ON_ModelComponent::Type::RenderMaterial).m_first_mcr_link;
    nullptr != link && ok;
    link = link->m_next
    )
  {
    ok = archive.Write3dmMaterialComponent(link->m_mcr);
    if ( !ok )
    {
      if ( error_log) error_log->Print("ONX_Model::Write archive.Write3dmMaterialComponent() failed.\n");
    }
  } 

  if ( !archive.EndWrite3dmMaterialTable() )
  {
    if ( error_log) error_log->Print("ONX_Model::Write archive.EndWrite3dmMaterialTable() failed.\n");
    return false;
  }
  if (!ok)
    return false;

  // LINETYPE TABLE
  if ( archive.Archive3dmVersion() >= 4 )
  {
    ok = archive.BeginWrite3dmLinetypeTable();
    if ( !ok )
    {
      if ( error_log) error_log->Print("ONX_Model::Write archive.BeginWrite3dmLinetypeTable() failed.\n");
      return false;
    }
    for( 
      class ONX_ModelComponentReferenceLink* link = Internal_ComponentListConst(ON_ModelComponent::Type::LinePattern).m_first_mcr_link;
      nullptr != link && ok;
      link = link->m_next
      )
    {
      ok = archive.Write3dmLinePatternComponent(link->m_mcr);
      if ( !ok )
      {
        if ( error_log) error_log->Print("ONX_Model::Write archive.Write3dmLinePatternComponent() failed.\n");
      }
    }
    if ( !archive.EndWrite3dmLinetypeTable() )
    {
      if ( error_log) error_log->Print("ONX_Model::Write archive.EndWrite3dmLinetypeTable() failed.\n");
      return false;
    }
    if (!ok)
      return false;
  }

  // LAYER TABLE
  ok = archive.BeginWrite3dmLayerTable();
  if ( !ok )
  {
    // make sure m_settings is valid
    if ( error_log) error_log->Print("ONX_Model::Write archive.BeginWrite3dmLayerTable() failed.\n");
    return false;
  }
  unsigned int layer_count = 0;
  for( 
    class ONX_ModelComponentReferenceLink* link = Internal_ComponentListConst(ON_ModelComponent::Type::Layer).m_first_mcr_link;
    nullptr != link && ok;
    link = link->m_next
    )
  {
    ok = archive.Write3dmLayerComponent(link->m_mcr);
    if (!ok)
    {
      if (error_log) error_log->Print("ONX_Model::Write archive.Write3dmLayerComponent() failed.\n");
    }
    else
      layer_count++;
  }
  if (0 == layer_count && ok)
  {
    ON_Layer layer(ON_Layer::Default);
    layer.SetId();
    layer.SetIndex(0);
    ok = archive.Write3dmLayer(layer);
    if (!ok)
    {
      if (error_log) error_log->Print("ONX_Model::Write archive.Write3dmLayer() failed.\n");
    }
  }
  if ( !archive.EndWrite3dmLayerTable() )
  {
    if ( error_log) error_log->Print("ONX_Model::Write archive.EndWrite3dmLayerTable() failed.\n");
    return false;
  }
  if (!ok)
    return false;

  // GROUP TABLE
  ok = archive.BeginWrite3dmGroupTable();
  if ( !ok )
  {
    // make sure m_settings is valid
    if ( error_log) error_log->Print("ONX_Model::Write archive.BeginWrite3dmGroupTable() failed.\n");
    return false;
  }
  for( 
    class ONX_ModelComponentReferenceLink* link = Internal_ComponentListConst(ON_ModelComponent::Type::Group).m_first_mcr_link;
    nullptr != link && ok;
    link = link->m_next
    )
  {
    ok = archive.Write3dmGroupComponent(link->m_mcr);
    if ( !ok )
    {
      if ( error_log) error_log->Print("ONX_Model::Write archive.Write3dmGroupComponent() failed.\n");
    }
  } 
  if ( !archive.EndWrite3dmGroupTable() )
  {
    if ( error_log) error_log->Print("ONX_Model::Write archive.EndWrite3dmGroupTable() failed.\n");
    return false;
  }
  if (!ok)
    return false;

  // DIMSTYLE TABLE
  if ( archive.Archive3dmVersion() >= 3 )
  {
    ok = archive.BeginWrite3dmDimStyleTable();
    if ( !ok )
    {
      // make sure m_settings is valid
      if ( error_log) error_log->Print("ONX_Model::Write archive.BeginWrite3dmDimStyleTable() failed.\n");
      return false;
    }
    for( 
      class ONX_ModelComponentReferenceLink* link = Internal_ComponentListConst(ON_ModelComponent::Type::DimStyle).m_first_mcr_link;
      nullptr != link;
      link = link->m_next
      )
    {
      ok = archive.Write3dmDimStyleComponent(link->m_mcr);
      if (!ok)
      {
        if ( error_log) error_log->Print("ONX_Model::Write archive.Write3dmDimStyleComponent() failed.\n");
      }
    }
    if ( !archive.EndWrite3dmDimStyleTable() )
    {
      if ( error_log) error_log->Print("ONX_Model::Write archive.EndWrite3dmDimStyleTable() failed.\n");
      return false;
    }
    if (!ok)
      return false;
  }

  // LIGHT TABLE
  ok = archive.BeginWrite3dmLightTable();
  if ( !ok )
  {
    // make sure m_settings is valid
    if ( error_log) error_log->Print("ONX_Model::Write archive.BeginWrite3dmLightTable() failed.\n");
    return false;
  }
  for( 
    class ONX_ModelComponentReferenceLink* link = Internal_ComponentListConst(ON_ModelComponent::Type::RenderLight).m_first_mcr_link;
    nullptr != link;
    link = link->m_next
    )
  {
    ok = archive.Write3dmModelLightComponent(link->m_mcr);
    if ( !ok )
    {
      if ( error_log) error_log->Print("ONX_Model::Write archive.Write3dmModelLightComponent() failed.\n");
    }
  }
  if ( !archive.EndWrite3dmLightTable() )
  {
    if ( error_log) error_log->Print("ONX_Model::Write archive.EndWrite3dmLightTable() failed.\n");
    return false;
  }
  if (!ok)
    return false;

  // HATCH PATTERN TABLE
  if ( archive.Archive3dmVersion() >= 4 )
  {
    ok = archive.BeginWrite3dmHatchPatternTable();
    if ( !ok )
    {
      if ( error_log) error_log->Print("ONX_Model::Write archive.BeginWrite3dmHatchPatternTable() failed.\n");
      return false;
    }

    for( 
      class ONX_ModelComponentReferenceLink* link = Internal_ComponentListConst(ON_ModelComponent::Type::HatchPattern).m_first_mcr_link;
      nullptr != link;
      link = link->m_next
      )
    {
      ok = archive.Write3dmHatchPatternComponent(link->m_mcr);
      if ( !ok )
      {
        if ( error_log) error_log->Print("ONX_Model::Write archive.Write3dmHatchPatternComponent() failed.\n");
      }
    }

    if ( !archive.EndWrite3dmHatchPatternTable() )
    {
      if ( error_log) error_log->Print("ONX_Model::Write archive.EndWrite3dmHatchPatternTable() failed.\n");
      return false;
    }
    if (!ok)
      return false;
  }

  // INSTANCE DEFINITION TABLE
  if ( archive.Archive3dmVersion() >= 3 )
  {
    ok = archive.BeginWrite3dmInstanceDefinitionTable();
    if ( !ok )
    {
      // make sure m_settings is valid
      if ( error_log) error_log->Print("ONX_Model::Write archive.BeginWrite3dmInstanceDefinitionTable() failed.\n");
      return false;
    }
    for( 
      class ONX_ModelComponentReferenceLink* link = Internal_ComponentListConst(ON_ModelComponent::Type::InstanceDefinition).m_first_mcr_link;
      nullptr != link;
      link = link->m_next
      )
    {
      ok = archive.Write3dmInstanceDefinitionComponent(link->m_mcr);
      if ( !ok )
      {
        if ( error_log) error_log->Print("ONX_Model::Write archive.Write3dmInstanceDefinitionComponent() failed.\n");
      }
    }
    if ( !archive.EndWrite3dmInstanceDefinitionTable() )
    {
      if ( error_log) error_log->Print("ONX_Model::Write archive.EndWrite3dmInstanceDefinitionTable() failed.\n");
      return false;
    }
    if (!ok)
      return false;
  }

  // OBJECT TABLE
  ok = archive.BeginWrite3dmObjectTable();
  if ( !ok )
  {
    if ( error_log) error_log->Print("ONX_Model::Write archive.BeginWrite3dmObjectTable() failed.\n");
    return false;
  }
  for( 
    class ONX_ModelComponentReferenceLink* link = Internal_ComponentListConst(ON_ModelComponent::Type::ModelGeometry).m_first_mcr_link;
    nullptr != link;
    link = link->m_next
    )
  {
    ok = archive.Write3dmModelGeometryComponent(link->m_mcr);
    if ( !ok )
    {
      if ( error_log)
        error_log->Print("ONX_Model::Write archive.Write3dmModelGeometryComponent() failed.\n");
    }
  }
  if ( !archive.EndWrite3dmObjectTable() )
  {
    if ( error_log) 
      error_log->Print("ONX_Model::Write archive.EndWrite3dmObjectTable() failed.\n");
    return false;
  }
  if (!ok)
    return false;

  // HISTORY RECORD TABLE
  if ( archive.Archive3dmVersion() >= 4 )
  {
    ok = archive.BeginWrite3dmHistoryRecordTable();
    if ( !ok )
    {
      if ( error_log) error_log->Print("ONX_Model::Write archive.BeginWrite3dmHistoryRecordTable() failed.\n");
      return false;
    }

    for( 
      class ONX_ModelComponentReferenceLink* link = Internal_ComponentListConst(ON_ModelComponent::Type::HistoryRecord).m_first_mcr_link;
      nullptr != link;
      link = link->m_next
      )
    {
      ok = archive.Write3dmHistoryRecordComponent(link->m_mcr);
      if ( !ok )
      {
        if ( error_log) error_log->Print("ONX_Model::Write archive.Write3dmistoryRecordComponent() failed.\n");
      }
    }


    if( !archive.EndWrite3dmHistoryRecordTable() )
    {
      if ( error_log) error_log->Print("ONX_Model::Write archive.EndWrite3dmHistoryTable() failed.\n");
      return false;
    }
    if (!ok)
      return false;
  }

  // STEP 17: - write user tables (plug-in info, etc.)
  if (archive.ArchiveContains3dmTable(ON_3dmArchiveTableType::user_table))
  {
    if (nullptr != m_model_user_string_list && m_model_user_string_list->UserStringCount() > 0)
    {
      // Write the document user strings (key-value pairs) as
      // a user table with plug-in id = 
      ON_UUID model_user_string_plugin_id = ON_CLASS_ID(ON_DocumentUserStringList);
      if (archive.BeginWrite3dmUserTable(model_user_string_plugin_id, false, 0, 0))
      {
        archive.WriteObject(m_model_user_string_list);
        archive.EndWrite3dmUserTable();
      }
    }

    // USER DATA TABLE
    for (int i = 0; ok && i < m_userdata_table.Count(); i++)
    {
      const ONX_Model_UserData* model_ud = m_userdata_table[i];
      if (nullptr == model_ud)
        continue;
      if (ON_UuidIsNotNil(model_ud->m_uuid))
      {
        if (!archive.Write3dmAnonymousUserTableRecord(
          model_ud->m_uuid,
          model_ud->m_usertable_3dm_version,
          model_ud->m_usertable_opennurbs_version,
          model_ud->m_goo)
          )
        {
          continue;
        }
      }
    }
  }

  if ( !archive.Write3dmEndMark() )
  {
    ok = false;
    if ( error_log) error_log->Print("ONX_Model::Write archive.Write3dmEndMark() failed.\n");
  }

  return ok;
}